

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.c
# Opt level: O0

int32 interp_cd_ci(interp_t *ip,int32 *senscr,int32 cd,int32 ci)

{
  int iVar1;
  int32 ci_local;
  int32 cd_local;
  int32 *senscr_local;
  interp_t *ip_local;
  
  if ((ci < 0) || (ip->n_sen <= ci)) {
    __assert_fail("(ci >= 0) && (ci < ip->n_sen)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                  ,0xa9,"int32 interp_cd_ci(interp_t *, int32 *, int32, int32)");
  }
  if ((-1 < cd) && (cd < ip->n_sen)) {
    iVar1 = logmath_add(ip->logmath,senscr[cd] + ip->wt[cd].cd,senscr[ci] + ip->wt[cd].ci);
    senscr[cd] = iVar1;
    return 0;
  }
  __assert_fail("(cd >= 0) && (cd < ip->n_sen)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                ,0xaa,"int32 interp_cd_ci(interp_t *, int32 *, int32, int32)");
}

Assistant:

int32
interp_cd_ci(interp_t * ip, int32 * senscr, int32 cd, int32 ci)
{
    assert((ci >= 0) && (ci < ip->n_sen));
    assert((cd >= 0) && (cd < ip->n_sen));

    senscr[cd] = logmath_add(ip->logmath,
                             senscr[cd] + ip->wt[cd].cd,
                             senscr[ci] + ip->wt[cd].ci);

    return 0;
}